

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr
GetFunctionTypeName(ExpressionContext *ctx,TypeBase *returnType,IntrusiveList<TypeHandle> arguments)

{
  char *__src;
  int iVar1;
  TypeHandle *pTVar2;
  undefined4 extraout_var;
  size_t sVar3;
  TypeBase *pTVar4;
  ulong uVar5;
  uint uVar6;
  TypeHandle *pTVar7;
  uint uVar9;
  char *pcVar10;
  InplaceStr IVar11;
  TypeHandle *pTVar8;
  
  pTVar4 = (TypeBase *)arguments.tail;
  pTVar7 = arguments.head;
  uVar9 = (*(int *)&(returnType->name).end - *(int *)&(returnType->name).begin) + 7;
  pTVar2 = pTVar7;
  pTVar8 = pTVar7;
  while (pTVar2 != (TypeHandle *)0x0) {
    pTVar4 = pTVar2->type;
    pTVar2 = pTVar2->next;
    uVar6 = *(int *)&(pTVar4->name).end - *(int *)&(pTVar4->name).begin;
    pTVar8 = (TypeHandle *)(ulong)uVar6;
    uVar9 = ((uVar9 + 1) - (uint)(pTVar2 == (TypeHandle *)0x0)) + uVar6;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar9,pTVar8,pTVar4);
  IVar11.begin = (char *)CONCAT44(extraout_var,iVar1);
  pcVar10 = (returnType->name).begin;
  if (pcVar10 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    memcpy(IVar11.begin,pcVar10,(ulong)(uint)(*(int *)&(returnType->name).end - (int)pcVar10));
    iVar1 = (int)(returnType->name).begin;
  }
  uVar5 = (ulong)(uint)(*(int *)&(returnType->name).end - iVar1);
  builtin_strncpy(IVar11.begin + uVar5," ref(",5);
  pcVar10 = IVar11.begin + uVar5 + 5;
  while (pTVar2 = pTVar7, pTVar2 != (TypeHandle *)0x0) {
    pTVar4 = pTVar2->type;
    __src = (pTVar4->name).begin;
    if (__src == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      memcpy(pcVar10,__src,(ulong)(uint)(*(int *)&(pTVar4->name).end - (int)__src));
      pTVar4 = pTVar2->type;
      iVar1 = (int)(pTVar4->name).begin;
    }
    pcVar10 = pcVar10 + (uint)(*(int *)&(pTVar4->name).end - iVar1);
    pTVar7 = (TypeHandle *)0x0;
    if (pTVar2->next != (TypeHandle *)0x0) {
      *pcVar10 = ',';
      pcVar10 = pcVar10 + 1;
      pTVar7 = pTVar2->next;
    }
  }
  pcVar10[0] = ')';
  pcVar10[1] = '\0';
  sVar3 = strlen(IVar11.begin);
  if (sVar3 + 1 == (ulong)uVar9) {
    IVar11.end = IVar11.begin + sVar3;
    return IVar11;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0xd7,
                "InplaceStr GetFunctionTypeName(ExpressionContext &, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

InplaceStr GetFunctionTypeName(ExpressionContext &ctx, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	unsigned nameLength = returnType->name.length() + unsigned(strlen(" ref()")) + 1;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
		nameLength += arg->type->name.length() + (arg->next ? 1 : 0);

	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	if(returnType->name.begin)
		memcpy(pos, returnType->name.begin, returnType->name.length());
	pos += returnType->name.length();

	memcpy(pos, " ref(", 5);
	pos += 5;

	for(TypeHandle *arg = arguments.head; arg; arg = arg->next)
	{
		if(arg->type->name.begin)
			memcpy(pos, arg->type->name.begin, arg->type->name.length());
		pos += arg->type->name.length();

		if(arg->next)
			*pos++ = ',';
	}

	*pos++ = ')';
	*pos++ = 0;

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}